

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_inter_dct_only(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  av1_extracfg *extra_cfg_00;
  aom_codec_alg_priv_t_conflict *in_RSI;
  long in_RDI;
  av1_extracfg extra_cfg;
  undefined1 local_268 [464];
  int local_98;
  aom_codec_alg_priv_t_conflict *local_10;
  
  local_10 = in_RSI;
  memcpy(local_268,(void *)(in_RDI + 0x458),600);
  uVar1 = *(uint *)&(local_10->base).err_detail;
  if (uVar1 < 0x29) {
    extra_cfg_00 = (av1_extracfg *)
                   ((long)(int)uVar1 + (long)(local_10->base).enc.cx_data_dst_buf.buf);
    *(uint *)&(local_10->base).err_detail = uVar1 + 8;
  }
  else {
    extra_cfg_00 = (av1_extracfg *)(local_10->base).init_flags;
    (local_10->base).init_flags = (aom_codec_flags_t)&extra_cfg_00->enable_auto_bwd_ref;
  }
  local_98 = extra_cfg_00->cpu_used;
  aVar2 = update_extra_cfg(local_10,extra_cfg_00);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_inter_dct_only(aom_codec_alg_priv_t *ctx,
                                               va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.use_inter_dct_only = CAST(AV1E_SET_INTER_DCT_ONLY, args);
  return update_extra_cfg(ctx, &extra_cfg);
}